

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O1

void __thiscall
TPZFrontSym<std::complex<double>_>::AddKel
          (TPZFrontSym<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *destinationindex)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  complex<double> *pcVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  lVar3 = destinationindex->fNElements;
  if (0 < lVar3) {
    lVar13 = 0;
    do {
      iVar7 = Local(this,destinationindex->fStore[lVar13]);
      lVar10 = (long)iVar7;
      lVar12 = lVar13;
      do {
        iVar7 = Local(this,destinationindex->fStore[lVar12]);
        if (((elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar13) ||
           ((elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar12)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar8 = (long)iVar7;
        lVar11 = lVar8;
        if (lVar8 < lVar10) {
          lVar11 = lVar10;
        }
        if (lVar10 < lVar8) {
          lVar8 = lVar10;
        }
        lVar11 = (lVar11 + 1) * lVar11;
        uVar9 = lVar11 - (lVar11 >> 0x3f) & 0xfffffffffffffffe;
        pcVar4 = (this->super_TPZFront<std::complex<double>_>).fData.fStore;
        dVar5 = *(double *)
                 (elmat->fElem
                  [(elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow * lVar12
                   + lVar13]._M_value + 8);
        pdVar1 = (double *)(pcVar4[lVar8]._M_value + uVar9 * 8);
        dVar6 = pdVar1[1];
        pdVar2 = (double *)(pcVar4[lVar8]._M_value + uVar9 * 8);
        *pdVar2 = *pdVar1 + *(double *)
                             elmat->fElem
                             [(elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                              fRow * lVar12 + lVar13]._M_value;
        pdVar2[1] = dVar6 + dVar5;
        lVar12 = lVar12 + 1;
      } while (lVar12 < lVar3);
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar3);
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel = destinationindex.NElements();
	for(i=0;i<nel;i++){
		ilocal = this->Local(destinationindex[i]);
		for(j=i;j<nel;j++) {
			jlocal=this->Local(destinationindex[j]);
			this->Element(ilocal, jlocal)+=elmat(i,j);
		}
	}
	/*
	 output << "Dest Index " ;
	 for(i=0;i<nel;i++) output << destinationindex[i] << " ";
	 output << endl;
	 elmat.Print("Element matrix ",output);
	 PrintGlobal("After Assemb..." , output);
	 */
}